

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O1

BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
* __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
::find(BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
       *__return_storage_ptr__,
      StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
      *this,string_view searchValue)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  iterator iVar4;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar5;
  int iVar6;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar7;
  key_type local_20;
  
  local_20._M_str = searchValue._M_str;
  local_20._M_len = searchValue._M_len;
  iVar4 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->lookup)._M_h,&local_20);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar6 = (this->dataStorage).bsize;
    ppuVar5 = (this->dataStorage).dataptr;
    if ((long)iVar6 == 0x20) {
      if (ppuVar5 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
        ppuVar5 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                  &StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                   ::end()::emptyValue;
      }
      else {
        ppuVar5 = ppuVar5 + (long)(this->dataStorage).dataSlotIndex + 1;
      }
      __return_storage_ptr__->vec = ppuVar5;
      __return_storage_ptr__->ptr = *ppuVar5;
      __return_storage_ptr__->offset = 0;
      return __return_storage_ptr__;
    }
    iVar1 = (this->dataStorage).dataSlotIndex;
    __return_storage_ptr__->vec = ppuVar5 + iVar1;
    __return_storage_ptr__->ptr = ppuVar5[iVar1] + iVar6;
    __return_storage_ptr__->offset = iVar6;
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar6 = (this->dataStorage).bsize;
    ppuVar5 = (this->dataStorage).dataptr;
    if ((long)iVar6 != 0x20) {
      ppuVar5 = ppuVar5 + (this->dataStorage).dataSlotIndex;
      puVar7 = *ppuVar5 + iVar6;
      goto LAB_00276798;
    }
    if (ppuVar5 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar5 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar5 = ppuVar5 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppuVar5 = (this->dataStorage).dataptr;
  }
  puVar7 = *ppuVar5;
  iVar6 = 0;
LAB_00276798:
  lVar2 = *(long *)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x18);
  __return_storage_ptr__->vec = ppuVar5;
  __return_storage_ptr__->ptr = puVar7 + lVar2;
  uVar3 = (int)lVar2 + iVar6;
  __return_storage_ptr__->offset = uVar3;
  if (0x1f < (int)uVar3) {
    __return_storage_ptr__->vec = ppuVar5 + (ulong)(uVar3 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar3 & 0x1f;
    __return_storage_ptr__->ptr =
         (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
         ((long)&(ppuVar5[(ulong)(uVar3 - 0x20 >> 5) + 1]->_M_t).
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl +
         (ulong)((uVar3 & 0x1f) << 3));
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }